

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

void loguru::write_hex_digit(string *out,uint num)

{
  undefined8 local_48;
  Text user_msg;
  Text fail_info;
  Text str_left;
  Text str_right;
  uint val_left;
  uint val_right;
  
  str_right._str._0_4_ = (uint)out;
  str_right._str._4_4_ = 0x10;
  if ((uint)str_right._str < 0x10) {
    std::__cxx11::string::push_back('H');
    return;
  }
  format_value<unsigned_int>((loguru *)&fail_info,(uint *)&str_right);
  format_value<unsigned_int>((loguru *)&str_left,(uint *)((long)&str_right._str + 4));
  textprintf((char *)&user_msg,"CHECK FAILED:  %s %s %s  (%s %s %s)  ","num","<","16u",
             fail_info._str,"<",str_left._str);
  textprintf();
  log_and_abort(0,user_msg._str,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ss16118[P]kapsel/libs/loguru/loguru.cpp"
                ,0x216,"%s",local_48);
}

Assistant:

static void write_hex_digit(std::string& out, unsigned num)
	{
		DCHECK_LT_F(num, 16u);
		if (num < 10u) { out.push_back(char('0' + num)); }
		else { out.push_back(char('A' + num - 10)); }
	}